

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int TryRun<std::_Bind<int(*(int,char_const**))(int,char_const**)>>
              (_Bind<int_(*(int,_const_char_**))(int,_const_char_**)> *f)

{
  int iVar1;
  stringstream stream_1;
  AdsException *ex;
  stringstream stream;
  exception *ex_1;
  stringstream stream_2;
  _Bind<int_(*(int,_const_char_**))(int,_const_char_**)> *f_local;
  
  iVar1 = std::_Bind<int(*(int,char_const**))(int,char_const**)>::operator()
                    ((_Bind<int(*(int,char_const**))(int,char_const**)> *)f);
  return iVar1;
}

Assistant:

int TryRun(T f)
{
    try {
        return f();
    } catch (const AdsException& ex) {
        LOG_ERROR("AdsException message: " << ex.what() << '\n');
        return ex.errorCode;
    } catch (const std::exception& ex) {
        LOG_ERROR("Exception: " << ex.what() << '\n');
        return -2;
    } catch (...) {
        LOG_ERROR("Unknown exception\n");
        return -1;
    }
}